

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O1

bool __thiscall lzham::symbol_codec::encode_arith_init(symbol_codec *this)

{
  uint *puVar1;
  output_symbol *poVar2;
  uint uVar3;
  bool bVar4;
  
  uVar3 = (this->m_output_syms).m_size;
  if (((this->m_output_syms).m_capacity <= uVar3) &&
     (bVar4 = elemental_vector::increase_capacity
                        ((elemental_vector *)&this->m_output_syms,uVar3 + 1,true,8,(object_mover)0x0
                         ,true), !bVar4)) {
    return false;
  }
  poVar2 = (this->m_output_syms).m_p + (this->m_output_syms).m_size;
  poVar2->m_bits = 0;
  poVar2->m_num_bits = -3;
  poVar2->m_arith_prob0 = 0;
  puVar1 = &(this->m_output_syms).m_size;
  *puVar1 = *puVar1 + 1;
  return true;
}

Assistant:

bool symbol_codec::encode_arith_init()
   {
      LZHAM_ASSERT(m_mode == cEncoding);

      output_symbol sym;
      sym.m_bits = 0;
      sym.m_num_bits = output_symbol::cArithInit;
      sym.m_arith_prob0 = 0;
      if (!m_output_syms.try_push_back(sym))
      {
         LZHAM_LOG_ERROR(4014);
         return false;
      }

      return true;
   }